

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fibonacci.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  size_t __n;
  void *__buf;
  string_view file_name;
  string_view func_name;
  ScopedTimer JEB_ScopedTimer_36;
  long *local_c8;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88 [2];
  long local_78 [2];
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  char local_40 [16];
  ostream *local_30;
  
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp:36: "
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_88);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_98 = *plVar4;
    lStack_90 = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
    local_a8 = (long *)*plVar2;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_b8 = *plVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar4;
    local_c8 = (long *)*plVar2;
  }
  lVar1 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar3 = _ZN8JEBDebugL6STREAME_0;
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_68[0x10] = true;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_c8,lVar1 + (long)local_c8);
  local_30 = poVar3;
  local_68._0_8_ = std::chrono::_V2::system_clock::now();
  local_68[0x10] = false;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  file_name._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp"
  ;
  file_name._M_len = 0x6b;
  func_name._M_str = "main";
  func_name._M_len = 4;
  __n = 4;
  JEBDebug::Profiler::start_timer
            ((Profiler *)JEBDebug::Profiler::instance_,file_name,func_name,0x28);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar3 = _ZN8JEBDebugL6STREAME_0;
  std::__ostream_insert<char,std::char_traits<char>>
            (_ZN8JEBDebugL6STREAME_0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/Fibonacci/Fibonacci.cpp:41: "
             ,0x70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"int main()",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tn = ",6);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tfibonacci_rec(n) = ",0x15);
  fibonacci_rec(0x1b);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tfibonacci_it(n) = ",0x14);
  fibonacci_it(0x1b);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  JEBDebug::Profiler::end_timer((Profiler *)JEBDebug::Profiler::instance_);
  JEBDebug::Profiler::write((Profiler *)JEBDebug::Profiler::instance_,0x1070c8,__buf,__n);
  JEBDebug::
  ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ScopedTimerImpl((ScopedTimerImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_68);
  return 0;
}

Assistant:

int main()
{
    JEB_TIMEIT();

    {
        const int n = 27;
        JEB_PROFILE();
        JEB_SHOW(n, fibonacci_rec(n), fibonacci_it(n));
    }
    JEB_PROFILER_REPORT();
    return 0;
}